

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::debug::StackTrace::StackTraceEntry::StackTraceEntry
          (StackTraceEntry *this,size_t index,char *loc,char *demang,char *hex,char *addr)

{
  char *in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  char *in_R9;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  undefined8 local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 5));
  std::__cxx11::string::string((string *)(in_RDI + 9));
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  *in_RDI = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,local_18,&local_51);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,local_20,&local_89);
  std::__cxx11::string::operator=((string *)(in_RDI + 5),local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,local_28,&local_b1);
  std::__cxx11::string::operator=((string *)(in_RDI + 9),local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,local_30,&local_d9);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xd),local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  return;
}

Assistant:

StackTrace::StackTraceEntry::StackTraceEntry(std::size_t index, const char* loc, const char* demang, const char* hex,
    const char* addr) {
  m_index = index;
  m_location = std::string(loc);
  m_demangled = std::string(demang);
  m_hex = std::string(hex);
  m_addr = std::string(addr);
}